

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_RedeemScriptConstructorTest_Test::SignParameter_RedeemScriptConstructorTest_Test
          (SignParameter_RedeemScriptConstructorTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006489f0;
  return;
}

Assistant:

TEST(SignParameter, RedeemScriptConstructorTest)
{
  const Script expect_script("2102ddeda4a5b67955c32247c28379cf3461c872e34f96ec94ddd61c66bbcfda1906ac");
  // constructor
  SignParameter sign_parameter = SignParameter(expect_script);
  CompareSignparameter(sign_parameter, expect_script.GetData(),
      SignDataType::kRedeemScript, Pubkey(), false, SigHashType(),
      expect_script.GetData());
}